

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypePrinter.cpp
# Opt level: O3

string * __thiscall
slang::ast::TypeArgFormatter::format_abi_cxx11_
          (string *__return_storage_ptr__,TypeArgFormatter *this,any *arg)

{
  Type *type;
  FormatBuffer *pFVar1;
  char *pcVar2;
  size_t sVar3;
  undefined8 *puVar4;
  pair<ska::detailv3::sherwood_v3_table<const_slang::ast::Type_*,_const_slang::ast::Type_*,_slang::Hasher<const_slang::ast::Type_*>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<const_slang::ast::Type_*>_>,_std::equal_to<const_slang::ast::Type_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::ast::Type_*>_>,_std::allocator<const_slang::ast::Type_*>,_std::allocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Type_*>_>_>::templated_iterator<const_slang::ast::Type_*>,_bool>
  pVar5;
  Type *local_20;
  
  puVar4 = (undefined8 *)std::__any_caster<slang::ast::Type_const*>(arg);
  if (puVar4 != (undefined8 *)0x0) {
    type = (Type *)*puVar4;
    local_20 = type;
    pVar5 = ska::detailv3::
            sherwood_v3_table<slang::ast::Type_const*,slang::ast::Type_const*,slang::Hasher<slang::ast::Type_const*>,ska::detailv3::functor_storage<unsigned_long,slang::Hasher<slang::ast::Type_const*>>,std::equal_to<slang::ast::Type_const*>,ska::detailv3::functor_storage<bool,std::equal_to<slang::ast::Type_const*>>,std::allocator<slang::ast::Type_const*>,std::allocator<ska::detailv3::sherwood_v3_entry<slang::ast::Type_const*>>>
            ::emplace<slang::ast::Type_const*>
                      ((sherwood_v3_table<slang::ast::Type_const*,slang::ast::Type_const*,slang::Hasher<slang::ast::Type_const*>,ska::detailv3::functor_storage<unsigned_long,slang::Hasher<slang::ast::Type_const*>>,std::equal_to<slang::ast::Type_const*>,ska::detailv3::functor_storage<bool,std::equal_to<slang::ast::Type_const*>>,std::allocator<slang::ast::Type_const*>,std::allocator<ska::detailv3::sherwood_v3_entry<slang::ast::Type_const*>>>
                        *)&this->seenTypes,&local_20);
    (this->printer).options.printAKA = (bool)(pVar5.second & 1);
    *(size_t *)
     ((long)&(((this->printer).buffer._M_t.
               super___uniq_ptr_impl<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>
               ._M_t.
               super__Tuple_impl<0UL,_slang::FormatBuffer_*,_std::default_delete<slang::FormatBuffer>_>
               .super__Head_base<0UL,_slang::FormatBuffer_*,_false>._M_head_impl)->buf).
             super_buffer<char> + 0x10) = 0;
    TypePrinter::append(&this->printer,type);
    pFVar1 = (this->printer).buffer._M_t.
             super___uniq_ptr_impl<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>.
             _M_t.
             super__Tuple_impl<0UL,_slang::FormatBuffer_*,_std::default_delete<slang::FormatBuffer>_>
             .super__Head_base<0UL,_slang::FormatBuffer_*,_false>._M_head_impl;
    pcVar2 = *(char **)((long)&(pFVar1->buf).super_buffer<char> + 8);
    sVar3 = *(size_t *)((long)&(pFVar1->buf).super_buffer<char> + 0x10);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,pcVar2,pcVar2 + sVar3);
    return __return_storage_ptr__;
  }
  std::__throw_bad_any_cast();
}

Assistant:

std::string TypeArgFormatter::format(const std::any& arg) {
    const Type& type = *std::any_cast<const Type*>(arg);
    bool unique = seenTypes.insert(&type).second;
    printer.options.printAKA = unique;

    printer.clear();
    printer.append(type);
    return printer.toString();
}